

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::mouseMoveEvent(QAbstractButton *this,QMouseEvent *e)

{
  bool bVar1;
  byte bVar2;
  QAbstractButtonPrivate *this_00;
  byte bVar3;
  socklen_t *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  uint __fd;
  QPointF *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  QAbstractButtonPrivate *d;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  QPoint local_30;
  QPointF local_28;
  QPoint local_18;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_10;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractButton *)0x50099e);
  local_10.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QSinglePointEvent::buttons
                 ((QSinglePointEvent *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
                 );
  local_c.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QFlags<Qt::MouseButton>::operator&
                 ((QFlags<Qt::MouseButton> *)
                  CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                  (MouseButton)((ulong)in_RDI >> 0x20));
  bVar1 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_c);
  bVar4 = true;
  if (!bVar1) {
    bVar4 = ((byte)this_00->field_0x28c >> 6 & 1) == 0;
  }
  if (bVar4) {
    QEvent::ignore((QEvent *)in_RSI);
  }
  else {
    local_28 = QSinglePointEvent::position((QSinglePointEvent *)0x500a1d);
    local_18 = QPointF::toPoint(in_RSI);
    bVar2 = (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,&local_18);
    bVar3 = (byte)this_00->field_0x28c >> 4 & 1;
    __addr_len = (socklen_t *)(ulong)bVar3;
    if ((bVar2 & 1) == bVar3) {
      QSinglePointEvent::position((QSinglePointEvent *)0x500ade);
      local_30 = QPointF::toPoint(in_RSI);
      bVar2 = (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,&local_30);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        QEvent::ignore((QEvent *)in_RSI);
      }
    }
    else {
      __fd = (((byte)this_00->field_0x28c >> 4 & 1) != 0 ^ 0xff) & 1;
      setDown((QAbstractButton *)in_RSI,SUB81((ulong)this_00 >> 0x38,0));
      QWidget::repaint(in_RDI);
      if (((byte)this_00->field_0x28c >> 4 & 1) == 0) {
        QAbstractButtonPrivate::emitReleased(this_00);
        __addr = extraout_RDX_00;
      }
      else {
        QAbstractButtonPrivate::emitPressed(this_00);
        __addr = extraout_RDX;
      }
      QEvent::accept((QEvent *)in_RSI,__fd,__addr,__addr_len);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QAbstractButton);
    if (!(e->buttons() & Qt::LeftButton) || !d->pressed) {
        e->ignore();
        return;
    }

    if (hitButton(e->position().toPoint()) != d->down) {
        setDown(!d->down);
        repaint();
        if (d->down)
            d->emitPressed();
        else
            d->emitReleased();
        e->accept();
    } else if (!hitButton(e->position().toPoint())) {
        e->ignore();
    }
}